

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void read_bitdepth(aom_read_bit_buffer *rb,SequenceHeader *seq_params,
                  aom_internal_error_info *error_info)

{
  int iVar1;
  undefined4 uVar2;
  aom_internal_error_info *in_RDX;
  long in_RSI;
  int twelve_bit;
  int high_bitdepth;
  
  iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)in_RDX);
  if ((*(char *)(in_RSI + 0x45) == '\x02') && (iVar1 != 0)) {
    iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)in_RDX);
    uVar2 = 10;
    if (iVar1 != 0) {
      uVar2 = 0xc;
    }
    *(undefined4 *)(in_RSI + 0x48) = uVar2;
  }
  else if (*(char *)(in_RSI + 0x45) < '\x03') {
    uVar2 = 8;
    if (iVar1 != 0) {
      uVar2 = 10;
    }
    *(undefined4 *)(in_RSI + 0x48) = uVar2;
  }
  else {
    aom_internal_error(in_RDX,AOM_CODEC_UNSUP_BITSTREAM,"Unsupported profile/bit-depth combination")
    ;
  }
  return;
}

Assistant:

static inline void read_bitdepth(struct aom_read_bit_buffer *rb,
                                 SequenceHeader *seq_params,
                                 struct aom_internal_error_info *error_info) {
  const int high_bitdepth = aom_rb_read_bit(rb);
  if (seq_params->profile == PROFILE_2 && high_bitdepth) {
    const int twelve_bit = aom_rb_read_bit(rb);
    seq_params->bit_depth = twelve_bit ? AOM_BITS_12 : AOM_BITS_10;
  } else if (seq_params->profile <= PROFILE_2) {
    seq_params->bit_depth = high_bitdepth ? AOM_BITS_10 : AOM_BITS_8;
  } else {
    aom_internal_error(error_info, AOM_CODEC_UNSUP_BITSTREAM,
                       "Unsupported profile/bit-depth combination");
  }
#if !CONFIG_AV1_HIGHBITDEPTH
  if (seq_params->bit_depth > AOM_BITS_8) {
    aom_internal_error(error_info, AOM_CODEC_UNSUP_BITSTREAM,
                       "Bit-depth %d not supported", seq_params->bit_depth);
  }
#endif
}